

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O0

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<float> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  random_engine *rng_;
  result_type_conflict2 rVar6;
  bool bVar7;
  int iVar8;
  rep rVar9;
  pointer P;
  pointer pi;
  reference sol;
  float theta_00;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float local_428;
  uint local_408;
  int iter;
  int remaining_1;
  int push;
  int remaining;
  long i_1;
  string_view local_3e0;
  undefined1 local_3d0 [8];
  file_observer obs;
  float kappa;
  int iStack_174;
  bool start_push;
  int e;
  int i;
  bit_array empty_x;
  bernoulli_distribution choose_mutation;
  compute_order compute;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  slv;
  long w_limit;
  float pushing_objective_amplifier;
  float pushing_k_factor;
  float delta;
  float theta;
  float alpha;
  float kappa_max;
  float kappa_step;
  default_cost_type<float> norm_costs;
  solver_parameters *p;
  int best_remaining;
  undefined1 local_50 [8];
  bit_array x;
  double cost_constant_local;
  default_cost_type<float> *original_costs_local;
  int variables_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::file_observer>
  *this_local;
  result *r;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ = 0;
  baryonyx::result::result(__return_storage_ptr__);
  bit_array::bit_array((bit_array *)local_50,variables);
  p._0_4_ = 0x7fffffff;
  norm_costs.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)this->m_ctx;
  normalize_costs<float,baryonyx::itm::default_cost_type<float>>
            ((itm *)&kappa_max,this->m_ctx,original_costs,this->m_rng,variables);
  dVar1 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20);
  dVar2 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x28);
  dVar3 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30);
  theta_00 = (float)*(double *)
                     ((long)norm_costs.linear_elements._M_t.
                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                            super__Head_base<0UL,_float_*,_false>._M_head_impl + 8);
  if (0.0 <= *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10)) {
    local_428 = (float)*(double *)
                        ((long)norm_costs.linear_elements._M_t.
                               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                               super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10);
  }
  else {
    local_428 = compute_delta<float,baryonyx::itm::default_cost_type<float>>
                          (this->m_ctx,(default_cost_type<float> *)&kappa_max,theta_00,variables);
  }
  dVar4 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x38);
  dVar5 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x40);
  slv._120_8_ = (BADTYPE)*(double *)
                          ((long)norm_costs.linear_elements._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa0);
  rng_ = this->m_rng;
  iVar8 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (constraints);
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::solver_inequalities_01coeff
            ((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
              *)&compute.order,rng_,iVar8,variables,(cost_type *)&kappa_max,constraints);
  compute_order::compute_order
            ((compute_order *)&choose_mutation,
             *(constraint_order *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xcc),variables);
  std::bernoulli_distribution::bernoulli_distribution
            ((bernoulli_distribution *)&empty_x.super_bit_array_impl.m_data,
             (this->m_ctx->parameters).init_policy_random);
  bit_array::bit_array((bit_array *)&e);
  iVar8 = *(int *)((long)norm_costs.linear_elements._M_t.
                         super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                         super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xd4);
  if (iVar8 == 0) {
    init_with_bastert<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)local_50,original_costs,variables,0);
  }
  else if (iVar8 == 1) {
    init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)local_50,(bit_array *)&e,this->m_rng,original_costs,constraints,1.0);
  }
  else if (iVar8 == 2) {
    init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)&e,(bit_array *)local_50,this->m_rng,original_costs,constraints,1.0);
  }
  iStack_174 = 0;
  iVar8 = bit_array_impl::size((bit_array_impl *)local_50);
  for (; iStack_174 != iVar8; iStack_174 = iStack_174 + 1) {
    rVar6 = std::bernoulli_distribution::operator()
                      ((bernoulli_distribution *)&empty_x.super_bit_array_impl.m_data,this->m_rng);
    if (rVar6) {
      bit_array_impl::invert((bit_array_impl *)local_50,iStack_174);
    }
  }
  bit_array::~bit_array((bit_array *)&e);
  obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       (float)*(double *)
               ((long)norm_costs.linear_elements._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e0,"img");
  file_observer::file_observer
            ((file_observer *)local_3d0,local_3e0,(int)slv.c,slv.c._4_4_,
             *(long *)((long)norm_costs.linear_elements._M_t.
                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                             super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb0));
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar9;
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar9;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array>
            ((compute_order *)&choose_mutation,
             (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
              *)&compute.order,(bit_array *)local_50);
  for (_push = 0;
      _push != *(long *)((long)norm_costs.linear_elements._M_t.
                               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                               super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb0);
      _push = _push + 1) {
    iVar8 = compute_order::
            run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                      ((compute_order *)&choose_mutation,
                       (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                        *)&compute.order,(bit_array *)local_50,this->m_rng,
                       obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,local_428,theta_00);
    P = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                  ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                   &slv.ap.m_cols_values.m_length);
    pi = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                   ((unique_ptr<float[],_std::default_delete<float[]>_> *)&slv.b);
    file_observer::make_observation<float>
              ((file_observer *)local_3d0,(sparse_matrix<int> *)&slv.rng,P,pi);
    if (iVar8 == 0) {
      dVar10 = default_cost_type<float>::results(original_costs,(bit_array *)local_50,cost_constant)
      ;
      store_if_better(this,(bit_array *)local_50,dVar10,_push);
      obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      break;
    }
    if (iVar8 < (int)p) {
      store_if_better(this,(bit_array *)local_50,iVar8,_push);
      p._0_4_ = iVar8;
    }
    if ((long)slv._120_8_ < _push) {
      auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar11._0_4_ = (float)iVar8 / (float)(int)slv.c;
      auVar13._0_8_ = std::pow(auVar11._0_8_,(double)(ulong)(uint)(float)dVar3);
      auVar13._8_56_ = extraout_var;
      auVar11 = vfmadd213ss_fma(auVar13._0_16_,ZEXT416((uint)(float)dVar1),
                                ZEXT416((uint)obs.m_ap_obs.m_value.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _0_4_));
      obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = auVar11._0_4_;
    }
    if ((float)dVar2 <
        obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_) {
      __return_storage_ptr__->status = kappa_max_reached;
      break;
    }
    bVar7 = is_timelimit_reached(this);
    if (bVar7) {
      __return_storage_ptr__->status = time_limit_reached;
      break;
    }
  }
  if ((obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    __return_storage_ptr__->status = limit_reached;
  }
  else {
    for (iter = 0;
        iter < *(int *)((long)norm_costs.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xbc);
        iter = iter + 1) {
      iVar8 = compute_order::
              push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                        ((compute_order *)&choose_mutation,
                         (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                          *)&compute.order,(bit_array *)local_50,this->m_rng,
                         (float)dVar4 *
                         obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,local_428,theta_00,
                         (float)dVar5);
      if (iVar8 == 0) {
        dVar10 = default_cost_type<float>::results
                           (original_costs,(bit_array *)local_50,cost_constant);
        store_if_better(this,(bit_array *)local_50,dVar10,
                        (long)(-iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc0) + -1));
      }
      bVar7 = is_timelimit_reached(this);
      if (bVar7) break;
      for (local_408 = 0;
          (int)local_408 <
          *(int *)((long)norm_costs.linear_elements._M_t.
                         super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                         super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc0);
          local_408 = local_408 + 1) {
        iVar8 = compute_order::
                run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                          ((compute_order *)&choose_mutation,
                           (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                            *)&compute.order,(bit_array *)local_50,this->m_rng,
                           obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,local_428,
                           theta_00);
        if (iVar8 == 0) {
          dVar10 = default_cost_type<float>::results
                             (original_costs,(bit_array *)local_50,cost_constant);
          store_if_better(this,(bit_array *)local_50,dVar10,
                          (long)(int)(~local_408 +
                                     -iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc0)));
          break;
        }
        if (*(double *)
             ((long)norm_costs.linear_elements._M_t.
                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa0) <
            (double)(int)local_408) {
          auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar12._0_4_ = (float)iVar8 / (float)(int)slv.c;
          auVar14._0_8_ = std::pow(auVar12._0_8_,(double)(ulong)(uint)(float)dVar3);
          auVar14._8_56_ = extraout_var_00;
          auVar11 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)(float)dVar1),
                                    ZEXT416((uint)obs.m_ap_obs.m_value.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_));
          obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = auVar11._0_4_;
        }
        if (((float)dVar2 <
             obs.m_ap_obs.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_) ||
           (bVar7 = is_timelimit_reached(this), bVar7)) break;
      }
    }
  }
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  bVar7 = bit_array_impl::empty((bit_array_impl *)&this->m_best);
  if (!bVar7) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    sol = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator[]
                    (&__return_storage_ptr__->solutions,0);
    convert<baryonyx::itm::minimize_tag>(&this->m_best,sol,variables);
  }
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ = 1;
  file_observer::~file_observer((file_observer *)local_3d0);
  compute_order::~compute_order((compute_order *)&choose_mutation);
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::~solver_inequalities_01coeff
            ((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
              *)&compute.order);
  default_cost_type<float>::~default_cost_type((default_cost_type<float> *)&kappa_max);
  bit_array::~bit_array((bit_array *)local_50);
  if ((x.super_bit_array_impl.m_data._M_t.
       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ & 1) == 0) {
    baryonyx::result::~result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }